

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetExtensionFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file,bool with_filename)

{
  string *filename;
  string *file_00;
  string local_180;
  byte local_15b;
  allocator local_15a;
  byte local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  undefined1 local_48 [8];
  string snake_name;
  bool with_filename_local;
  FileDescriptor *file_local;
  GeneratorOptions *options_local;
  
  snake_name.field_2._M_local_buf[0xf] = (byte)file & 1;
  file_00 = __return_storage_ptr__;
  filename = FileDescriptor::name_abi_cxx11_((FileDescriptor *)options);
  anon_unknown_0::GetSnakeFilename(&local_68,filename);
  StripProto((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  GetNamespace_abi_cxx11_(&local_118,this,options,(FileDescriptor *)file_00);
  anon_unknown_0::ToLower(&local_f8,&local_118);
  std::operator+(&local_b8,&local_d8,&local_f8);
  local_159 = 0;
  local_15b = 0;
  if ((snake_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::allocator<char>::allocator();
    local_15b = 1;
    std::__cxx11::string::string((string *)&local_138,"",&local_15a);
  }
  else {
    std::operator+(&local_158,"_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_159 = 1;
    std::operator+(&local_138,&local_158,"_extensions");
  }
  std::operator+(&local_98,&local_b8,&local_138);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_180,(GeneratorOptions *)this);
  std::operator+(__return_storage_ptr__,&local_98,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_138);
  if ((local_15b & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_15a);
  }
  if ((local_159 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_158);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtensionFileName(const GeneratorOptions& options,
                                 const FileDescriptor* file,
                                 bool with_filename) {
  std::string snake_name = StripProto(GetSnakeFilename(file->name()));
  return options.output_dir + "/" + ToLower(GetNamespace(options, file)) +
         (with_filename ? ("_" + snake_name + "_extensions") : "") +
         options.GetFileNameExtension();
}